

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Toggle_Button.H
# Opt level: O0

void __thiscall Fl_Toggle_Button::~Fl_Toggle_Button(Fl_Toggle_Button *this)

{
  Fl_Toggle_Button *this_local;
  
  ~Fl_Toggle_Button(this);
  operator_delete(this,0x80);
  return;
}

Assistant:

class FL_EXPORT Fl_Toggle_Button : public Fl_Button {
public:
  /**
    Creates a new Fl_Toggle_Button widget using the given
    position, size, and label string.
    <P>The inherited destructor deletes the toggle button.
  */
  Fl_Toggle_Button(int X,int Y,int W,int H,const char *l=0);
}